

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  char *__s;
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_t sVar4;
  Exception *pEVar5;
  ulong uVar6;
  ArrayPtr<kj::StringPtr> params;
  Fault f;
  StringPtr params_stack [8];
  undefined8 *local_3c0;
  ulong local_3b8;
  MainFunc *local_3b0;
  ulong local_3a8;
  char **local_3a0;
  Maybe<kj::Exception> local_398;
  Runnable local_238;
  MainFunc *local_230;
  char ***local_228;
  undefined8 **local_220;
  undefined8 local_218 [16];
  undefined8 local_198;
  Exception EStack_190;
  
  local_3a0 = argv;
  if (argc < 1) goto LAB_001ff4bf;
  local_3b8 = (ulong)(argc - 1);
  lVar1 = 0;
  do {
    *(char **)((long)local_218 + lVar1) = "";
    *(undefined8 *)((long)local_218 + lVar1 + 8) = 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  if ((uint)argc < 10) {
    puVar2 = local_218;
    pEVar5 = (Exception *)argv;
    uVar6 = 0;
    local_230 = func;
    local_3c0 = puVar2;
    if (argc != 1) goto LAB_001ff353;
  }
  else {
    puVar2 = (undefined8 *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,local_3b8,local_3b8,
                        _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::construct,
                        _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::destruct);
    pEVar5 = (Exception *)&_::HeapArrayDisposer::instance;
    uVar6 = local_3b8;
LAB_001ff353:
    uVar3 = 2;
    if (2 < argc) {
      uVar3 = (ulong)(uint)argc;
    }
    lVar1 = 0;
    local_3c0 = puVar2;
    local_3b0 = func;
    local_3a8 = uVar6;
    do {
      __s = *(char **)((long)argv + lVar1 + 8);
      sVar4 = strlen(__s);
      *(char **)((long)puVar2 + lVar1 * 2) = __s;
      *(size_t *)((long)puVar2 + lVar1 * 2 + 8) = sVar4 + 1;
      lVar1 = lVar1 + 8;
      local_230 = local_3b0;
    } while (uVar3 * 8 + -8 != lVar1);
  }
  local_238._vptr_Runnable = (_func_int **)&PTR_run_0027f708;
  local_228 = &local_3a0;
  local_220 = &local_3c0;
  _::runCatchingExceptions(&local_398,&local_238);
  local_198 = CONCAT71(local_198._1_7_,local_398.ptr.isSet);
  if (local_398.ptr.isSet != false) {
    EStack_190.ownFile.content.ptr = local_398.ptr.field_1.value.ownFile.content.ptr;
    EStack_190.ownFile.content.size_ = local_398.ptr.field_1.value.ownFile.content.size_;
    EStack_190.ownFile.content.disposer = local_398.ptr.field_1.value.ownFile.content.disposer;
    local_398.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_398.ptr.field_1.value.ownFile.content.size_ = 0;
    EStack_190.file = local_398.ptr.field_1.value.file;
    EStack_190.line = local_398.ptr.field_1.value.line;
    EStack_190.type = local_398.ptr.field_1.value.type;
    EStack_190.description.content.ptr = local_398.ptr.field_1.value.description.content.ptr;
    EStack_190.description.content.size_ = local_398.ptr.field_1.value.description.content.size_;
    local_398.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_398.ptr.field_1.value.description.content.size_ = 0;
    EStack_190.description.content.disposer =
         local_398.ptr.field_1.value.description.content.disposer;
    EStack_190.context.ptr.disposer = local_398.ptr.field_1.value.context.ptr.disposer;
    EStack_190.context.ptr.ptr = local_398.ptr.field_1.value.context.ptr.ptr;
    local_398.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(EStack_190.trace,(undefined1 *)((long)&local_398.ptr.field_1.value + 0x50),0x104);
    Exception::~Exception((Exception *)&local_398.ptr.field_1);
    str<char_const(&)[28],kj::Exception&>
              ((String *)&local_398,(kj *)"*** Uncaught exception ***\n",(char (*) [28])&EStack_190,
               pEVar5);
    pEVar5 = (Exception *)0x2214ff;
    if (local_398.ptr.field_1.value.ownFile.content.ptr != (char *)0x0) {
      pEVar5 = (Exception *)local_398.ptr._0_8_;
    }
    (*context->_vptr_ProcessContext[3])
              (context,pEVar5,
               local_398.ptr.field_1.value.ownFile.content.ptr +
               (local_398.ptr.field_1.value.ownFile.content.ptr == (char *)0x0));
    String::~String((String *)&local_398);
    local_398.ptr.isSet = (bool)(byte)local_198;
  }
  if ((local_398.ptr.isSet & 1U) != 0) {
    Exception::~Exception(&EStack_190);
  }
  (*context->_vptr_ProcessContext[1])(context);
LAB_001ff4bf:
  local_398.ptr._0_8_ = (Exception *)0x0;
  local_198 = 0;
  EStack_190.ownFile.content.ptr = (char *)0x0;
  _::Debug::Fault::init
            ((Fault *)&local_398,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
            );
  _::Debug::Fault::fatal((Fault *)&local_398);
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

#if !KJ_NO_EXCEPTIONS
  try {
#endif
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", *exception));
    }
    context.exit();
#if !KJ_NO_EXCEPTIONS
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
#endif
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}